

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

void __thiscall
pstd::vector<int,_pstd::pmr::polymorphic_allocator<int>_>::push_back
          (vector<int,_pstd::pmr::polymorphic_allocator<int>_> *this,int *value)

{
  int *in_RSI;
  polymorphic_allocator<int> *in_RDI;
  vector<int,_pstd::pmr::polymorphic_allocator<int>_> *unaff_retaddr;
  
  if (in_RDI[2].memoryResource == in_RDI[3].memoryResource) {
    reserve(unaff_retaddr,(size_t)in_RDI);
  }
  pmr::polymorphic_allocator<int>::construct<int,int_const&>
            (in_RDI,(int *)((long)&(in_RDI[1].memoryResource)->_vptr_memory_resource +
                           (long)in_RDI[3].memoryResource * 4),in_RSI);
  in_RDI[3].memoryResource =
       (memory_resource *)((long)&(in_RDI[3].memoryResource)->_vptr_memory_resource + 1);
  return;
}

Assistant:

void push_back(const T &value) {
        if (nAlloc == nStored)
            reserve(nAlloc == 0 ? 4 : 2 * nAlloc);

        alloc.construct(ptr + nStored, value);
        ++nStored;
    }